

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idx2Lookup.cpp
# Opt level: O1

file_id * idx2::ConstructFilePath
                    (file_id *__return_storage_ptr__,idx2_file *Idx2,u64 Brick,i8 Level,i8 Subband,
                    i16 BpKey)

{
  bool bVar1;
  idx2_file *piVar2;
  file_id *pfVar3;
  int iVar4;
  int iVar5;
  ulong uVar6;
  char cVar7;
  byte bVar8;
  char *pcVar9;
  long lVar10;
  u64 uVar11;
  long *in_FS_OFFSET;
  printer Pr;
  printer local_70;
  idx2_file *local_58;
  char *local_50;
  file_id *local_48;
  u64 local_40;
  long local_38;
  
  pcVar9 = (char *)(*in_FS_OFFSET + -0x100);
  local_58 = Idx2;
  local_40 = Brick;
  printer::printer(&local_70,pcVar9,0x100);
  if ((FILE *)local_70.File == (FILE *)0x0 && local_70.Buf != (char *)0x0) {
    if ((long)local_70.Size < 2) {
      pcVar9 = "false && \"buffer too small\"";
LAB_00192044:
      __assert_fail(pcVar9,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/idx2Lookup.cpp"
                    ,0x60,"file_id idx2::ConstructFilePath(const idx2_file &, u64, i8, i8, i16)");
    }
    iVar4 = snprintf(local_70.Buf,(long)local_70.Size,"%.*s/%s/%s/",
                     (ulong)(uint)(local_58->Dir).Size,(local_58->Dir).field_0.Ptr,local_58,
                     local_58->Field);
    local_70.Buf = local_70.Buf + iVar4;
    iVar5 = local_70.Size - iVar4;
    bVar1 = local_70.Size < iVar4;
    local_70.Size = iVar5;
    if (iVar5 == 0 || bVar1) {
      pcVar9 = "false && \"buffer overflow?\"";
      goto LAB_00192044;
    }
  }
  else {
    if ((local_70.Buf != (char *)0x0) || ((FILE *)local_70.File == (FILE *)0x0)) {
      pcVar9 = "false && \"unavailable or ambiguous printer destination\"";
      goto LAB_00192044;
    }
    fprintf((FILE *)local_70.File,"%.*s/%s/%s/",(ulong)(uint)(local_58->Dir).Size,
            (local_58->Dir).field_0.Ptr,local_58,local_58->Field);
  }
  local_50 = pcVar9;
  local_48 = __return_storage_ptr__;
  if ((FILE *)local_70.File == (FILE *)0x0 && local_70.Buf != (char *)0x0) {
    if ((long)local_70.Size < 2) {
      pcVar9 = "false && \"buffer too small\"";
    }
    else {
      iVar5 = snprintf(local_70.Buf,(long)local_70.Size,"/L%02x",(ulong)(uint)(int)Level);
      local_70.Buf = local_70.Buf + iVar5;
      iVar4 = local_70.Size - iVar5;
      if (local_70.Size - iVar5 != 0 && iVar5 <= local_70.Size) goto LAB_00191dac;
      pcVar9 = "false && \"buffer overflow?\"";
    }
  }
  else {
    if ((local_70.Buf == (char *)0x0) && ((FILE *)local_70.File != (FILE *)0x0)) {
      fprintf((FILE *)local_70.File,"/L%02x",(ulong)(uint)(int)Level);
      iVar4 = local_70.Size;
LAB_00191dac:
      local_70.Size = iVar4;
      piVar2 = local_58;
      if (Level < '\x10') {
        lVar10 = (long)Level;
        uVar11 = local_40;
        uVar6 = 0;
        local_38 = lVar10;
        do {
          pfVar3 = local_48;
          pcVar9 = local_50;
          if ((ulong)(piVar2->FilesDirsDepth).Arr[lVar10].Len <= uVar6 + 1) {
            if ((FILE *)local_70.File == (FILE *)0x0 && local_70.Buf != (char *)0x0) {
              if ((long)local_70.Size < 2) {
                pcVar9 = "false && \"buffer too small\"";
              }
              else {
                iVar5 = snprintf(local_70.Buf,(long)local_70.Size,".bin");
                local_70.Buf = local_70.Buf + iVar5;
                iVar4 = local_70.Size - iVar5;
                if (local_70.Size - iVar5 != 0 && iVar5 <= local_70.Size) goto LAB_00191f72;
                pcVar9 = "false && \"buffer overflow?\"";
              }
            }
            else {
              if ((local_70.Buf == (char *)0x0) && ((FILE *)local_70.File != (FILE *)0x0)) {
                fwrite(".bin",4,1,(FILE *)local_70.File);
                iVar4 = local_70.Size;
LAB_00191f72:
                local_70.Size = iVar4;
                uVar6 = (ulong)(local_58->BricksPerFile).Arr[local_38];
                lVar10 = 0x3f;
                if (uVar6 != 0) {
                  for (; uVar6 >> lVar10 == 0; lVar10 = lVar10 + -1) {
                  }
                }
                bVar8 = -(uVar6 == 0) | (byte)lVar10;
                (pfVar3->Name).field_0.Ptr = pcVar9;
                (pfVar3->Name).Size = local_70.Size;
                pfVar3->Id = (local_40 >> ((1L << (bVar8 & 0x3f) != uVar6) + bVar8 & 0x3f)) *
                             0x40000 + ((ulong)(byte)Level << 0x3c);
                return pfVar3;
              }
              pcVar9 = "false && \"unavailable or ambiguous printer destination\"";
            }
            __assert_fail(pcVar9,
                          "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/idx2Lookup.cpp"
                          ,99,"file_id idx2::ConstructFilePath(const idx2_file &, u64, i8, i8, i16)"
                         );
          }
          if (uVar6 == 4) {
            pcVar9 = 
            "t &idx2::stack_array<signed char, 4>::operator[](int) const [t = signed char, N = 4]";
            goto LAB_00191ff0;
          }
          cVar7 = (piVar2->FilesDirsDepth).Arr[lVar10].Arr[uVar6] -
                  (local_58->BricksOrderStr).Buffer.Data[lVar10 * 0x81 + 0x80];
          if ((FILE *)local_70.File == (FILE *)0x0 && local_70.Buf != (char *)0x0) {
            if ((long)local_70.Size < 2) {
              pcVar9 = "false && \"buffer too small\"";
LAB_00192013:
              __assert_fail(pcVar9,
                            "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/idx2Lookup.cpp"
                            ,0x62,
                            "file_id idx2::ConstructFilePath(const idx2_file &, u64, i8, i8, i16)");
            }
            bVar8 = -cVar7;
            iVar5 = snprintf(local_70.Buf,(long)local_70.Size,"/B%lx",
                             ((uVar11 >> (bVar8 & 0x3f)) << (bVar8 & 0x3f)) >> (bVar8 & 0x3f));
            local_70.Buf = local_70.Buf + iVar5;
            iVar4 = local_70.Size - iVar5;
            if (local_70.Size - iVar5 == 0 || local_70.Size < iVar5) {
              pcVar9 = "false && \"buffer overflow?\"";
              goto LAB_00192013;
            }
          }
          else {
            if ((local_70.Buf != (char *)0x0) || ((FILE *)local_70.File == (FILE *)0x0)) {
              pcVar9 = "false && \"unavailable or ambiguous printer destination\"";
              goto LAB_00192013;
            }
            bVar8 = -cVar7;
            fprintf((FILE *)local_70.File,"/B%lx",
                    ((uVar11 >> (bVar8 & 0x3f)) << (bVar8 & 0x3f)) >> (bVar8 & 0x3f));
            iVar4 = local_70.Size;
          }
          local_70.Size = iVar4;
          uVar11 = uVar11 << ((piVar2->FilesDirsDepth).Arr[lVar10].Arr[uVar6] & 0x3fU);
          uVar6 = uVar6 + 1;
        } while (Level < '\x10');
      }
      pcVar9 = 
      "t &idx2::stack_array<idx2::stack_array<signed char, 4>, 16>::operator[](int) const [t = idx2::stack_array<signed char, 4>, N = 16]"
      ;
LAB_00191ff0:
      __assert_fail("Idx < N",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/Common.h"
                    ,0x20c,pcVar9);
    }
    pcVar9 = "false && \"unavailable or ambiguous printer destination\"";
  }
  __assert_fail(pcVar9,
                "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/idx2Lookup.cpp"
                ,0x61,"file_id idx2::ConstructFilePath(const idx2_file &, u64, i8, i8, i16)");
}

Assistant:

file_id
ConstructFilePath(const idx2_file& Idx2, u64 Brick, i8 Level, i8 Subband, i16 BpKey)
{
  //i16 BpFileKey = (BpKey * Idx2.BitPlanesPerChunk) / Idx2.BitPlanesPerFile;
#define idx2_PrintLevel idx2_Print(&Pr, "/L%02x", Level);
#define idx2_PrintBrick                                                                            \
  for (int Depth = 0; Depth + 1 < Idx2.FilesDirsDepth[Level].Len; ++Depth)                         \
  {                                                                                                \
    int BitLen =                                                                                   \
      idx2_BitSizeOf(u64) - Idx2.BricksOrderStr[Level].Len + Idx2.FilesDirsDepth[Level][Depth];    \
    idx2_Print(&Pr, "/B%" PRIx64, TakeFirstBits(Brick, BitLen));                                   \
    Brick <<= Idx2.FilesDirsDepth[Level][Depth];                                                   \
    Shift += Idx2.FilesDirsDepth[Level][Depth];                                                    \
  }
#define idx2_PrintExtension idx2_Print(&Pr, ".bin");
  u64 BrickBackup = Brick;
  int Shift = 0;
  thread_local static char FilePath[256];
  printer Pr(FilePath, sizeof(FilePath));
  idx2_Print(&Pr, "%.*s/%s/%s/", Idx2.Dir.Size, Idx2.Dir.ConstPtr, Idx2.Name, Idx2.Field);
  idx2_PrintLevel;
  idx2_PrintBrick;
  idx2_PrintExtension;
  u64 FileId = GetFileAddress(Idx2, BrickBackup, Level, Subband, BpKey);
  return file_id{ stref{ FilePath, Pr.Size }, FileId };
#undef idx2_PrintLevel
#undef idx2_PrintBrick
#undef idx2_PrintSubband
#undef idx2_PrintBitPlane
#undef idx2_PrintExtension
}